

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint huffmanDecodeSymbol(LodePNGBitReader *reader,HuffmanTree *codetree)

{
  byte bVar1;
  size_t sVar2;
  uint uVar3;
  uint uVar4;
  long in_RDX;
  ushort uVar5;
  long lVar6;
  
  uVar3 = reader->buffer;
  bVar1 = *(byte *)((long)&codetree->codes + (ulong)(uVar3 & 0x1ff));
  uVar5 = *(ushort *)(in_RDX + (ulong)(uVar3 & 0x1ff) * 2);
  if ((ulong)bVar1 < 10) {
    reader->buffer = uVar3 >> (bVar1 & 0x1f);
    reader->bp = reader->bp + (ulong)bVar1;
  }
  else {
    uVar3 = uVar3 >> 9;
    reader->buffer = uVar3;
    sVar2 = reader->bp;
    reader->bp = sVar2 + 9;
    lVar6 = (ulong)(~(-1 << (bVar1 - 9 & 0x1f)) & uVar3) + (ulong)uVar5;
    uVar4 = *(byte *)((long)&codetree->codes + lVar6) - 9;
    reader->buffer = uVar3 >> ((byte)uVar4 & 0x1f);
    reader->bp = uVar4 + sVar2 + 9;
    uVar5 = *(ushort *)(in_RDX + lVar6 * 2);
  }
  return (uint)uVar5;
}

Assistant:

static unsigned huffmanDecodeSymbol(LodePNGBitReader* reader, const HuffmanTree* codetree) {
  unsigned short code = peekBits(reader, FIRSTBITS);
  unsigned short l = codetree->table_len[code];
  unsigned short value = codetree->table_value[code];
  if(l <= FIRSTBITS) {
    advanceBits(reader, l);
    return value;
  } else {
    unsigned index2;
    advanceBits(reader, FIRSTBITS);
    index2 = value + peekBits(reader, l - FIRSTBITS);
    advanceBits(reader, codetree->table_len[index2] - FIRSTBITS);
    return codetree->table_value[index2];
  }
}